

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O1

RealType __thiscall OpenMD::AtomType::getMass(AtomType *this)

{
  bool bVar1;
  mapped_type_conflict1 *pmVar2;
  byte bVar3;
  RealType RVar4;
  key_type local_40;
  
  bVar1 = this->hasBase_;
  if (bVar1 == true) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mass","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->myResponsibilities_,&local_40);
    bVar3 = *pmVar2 ^ 1;
  }
  else {
    bVar3 = 0;
  }
  if ((bVar1 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == 0) {
    RVar4 = this->mass_;
  }
  else {
    RVar4 = getMass(this->base_);
  }
  return RVar4;
}

Assistant:

RealType AtomType::getMass(void) {
    if (hasBase_ && !myResponsibilities_["mass"])
      return base_->getMass();
    else
      return mass_;
  }